

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O0

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QMainWindow *pQVar1;
  bool bVar2;
  QWidget *pQVar3;
  QVBoxLayout *pQVar4;
  QPushButton *pQVar5;
  QHBoxLayout *pQVar6;
  QLabel *pQVar7;
  QSpacerItem *pQVar8;
  GameBoard *pGVar9;
  QMenuBar *pQVar10;
  QStatusBar *pQVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView local_2c0;
  QString local_2b0;
  QRect local_298;
  QByteArrayView local_288;
  QString local_278;
  QFlags<Qt::AlignmentFlag> local_25c;
  QByteArrayView local_258;
  QString local_248;
  QFlags<Qt::AlignmentFlag> local_22c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_228;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_224;
  QByteArrayView local_220;
  QString local_210;
  QFlags<Qt::WindowType> local_1f8;
  QFlags<Qt::AlignmentFlag> local_1f4;
  QByteArrayView local_1f0;
  QString local_1e0;
  QFlags<Qt::WindowType> local_1c4;
  QByteArrayView local_1c0;
  QString local_1b0;
  QFlags<Qt::AlignmentFlag> local_194;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_190;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_18c;
  QByteArrayView local_188;
  QString local_178;
  QFlags<Qt::WindowType> local_15c;
  QFlags<Qt::AlignmentFlag> local_158;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_154;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_150;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_14c;
  undefined1 auStack_148 [4];
  QSizePolicy sizePolicy;
  QString local_138;
  QFlags<Qt::WindowType> local_11c;
  QByteArrayView local_118;
  QString local_108;
  QFlags<Qt::AlignmentFlag> local_ec;
  QByteArrayView local_e8;
  QString local_d8;
  QByteArrayView local_c0;
  QString local_b0;
  QByteArrayView local_98;
  QString local_88;
  QFlags<Qt::WindowType> local_6c;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QMainWindow *local_18;
  QMainWindow *MainWindow_local;
  Ui_MainWindow *this_local;
  
  local_18 = MainWindow;
  MainWindow_local = (QMainWindow *)this;
  QObject::objectName();
  bVar2 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar1 = local_18;
  if (bVar2) {
    QByteArrayView::QByteArrayView<11ul>(&local_68,(char (*) [11])"MainWindow");
    QVar12.m_data = (storage_type *)local_68.m_size;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    QObject::setObjectName((QString *)pQVar1);
    QString::~QString(&local_58);
  }
  QWidget::resize((QWidget *)local_18,0x250,0x1d7);
  pQVar3 = (QWidget *)operator_new(0x28);
  pQVar1 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_6c);
  QWidget::QWidget(pQVar3,(QWidget *)pQVar1,(QFlags_conflict *)(ulong)local_6c.i);
  this->centralwidget = pQVar3;
  pQVar3 = this->centralwidget;
  QByteArrayView::QByteArrayView<14ul>(&local_98,(char (*) [14])"centralwidget");
  QVar13.m_data = (storage_type *)local_98.m_size;
  QVar13.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_88);
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4,this->centralwidget);
  this->verticalLayout = pQVar4;
  pQVar4 = this->verticalLayout;
  QByteArrayView::QByteArrayView<15ul>(&local_c0,(char (*) [15])"verticalLayout");
  QVar14.m_data = (storage_type *)local_c0.m_size;
  QVar14.m_size = (qsizetype)&local_b0;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_b0);
  pQVar5 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar5,this->centralwidget);
  this->beginNewGameButton = pQVar5;
  pQVar5 = this->beginNewGameButton;
  QByteArrayView::QByteArrayView<19ul>(&local_e8,(char (*) [19])"beginNewGameButton");
  QVar15.m_data = (storage_type *)local_e8.m_size;
  QVar15.m_size = (qsizetype)&local_d8;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_d8);
  pQVar3 = (QWidget *)this->verticalLayout;
  pQVar5 = this->beginNewGameButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_ec);
  QBoxLayout::addWidget(pQVar3,(int)pQVar5,(QFlags_conflict *)0x0);
  pQVar6 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar6);
  this->horizontalLayout = pQVar6;
  pQVar6 = this->horizontalLayout;
  QByteArrayView::QByteArrayView<17ul>(&local_118,(char (*) [17])"horizontalLayout");
  QVar16.m_data = (storage_type *)local_118.m_size;
  QVar16.m_size = (qsizetype)&local_108;
  QString::fromUtf8(QVar16);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_108);
  pQVar7 = (QLabel *)operator_new(0x28);
  pQVar3 = this->centralwidget;
  QFlags<Qt::WindowType>::QFlags(&local_11c);
  QLabel::QLabel(pQVar7,pQVar3,(QFlags_conflict *)(ulong)local_11c.i);
  this->player1Label = pQVar7;
  pQVar7 = this->player1Label;
  QByteArrayView::QByteArrayView<13ul>((QByteArrayView *)auStack_148,(char (*) [13])"player1Label");
  QVar17.m_data = _auStack_148;
  QVar17.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar17);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_138);
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_14c.bits,Preferred,Fixed,DefaultType);
  QSizePolicy::setHorizontalStretch((QSizePolicy *)&local_14c.bits,0);
  QSizePolicy::setVerticalStretch((QSizePolicy *)&local_14c.bits,0);
  local_150.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_150.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_14c.bits,bVar2);
  local_154 = local_14c;
  QWidget::setSizePolicy((QSizePolicy *)this->player1Label);
  pQVar3 = (QWidget *)this->horizontalLayout;
  pQVar7 = this->player1Label;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_158);
  QBoxLayout::addWidget(pQVar3,(int)pQVar7,(QFlags_conflict *)0x0);
  pQVar7 = (QLabel *)operator_new(0x28);
  pQVar3 = this->centralwidget;
  QFlags<Qt::WindowType>::QFlags(&local_15c);
  QLabel::QLabel(pQVar7,pQVar3,(QFlags_conflict *)(ulong)local_15c.i);
  this->player1Score = pQVar7;
  pQVar7 = this->player1Score;
  QByteArrayView::QByteArrayView<13ul>(&local_188,(char (*) [13])"player1Score");
  QVar18.m_data = (storage_type *)local_188.m_size;
  QVar18.m_size = (qsizetype)&local_178;
  QString::fromUtf8(QVar18);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_178);
  local_18c.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_18c.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_14c.bits,bVar2);
  local_190 = local_14c;
  QWidget::setSizePolicy((QSizePolicy *)this->player1Score);
  pQVar3 = (QWidget *)this->horizontalLayout;
  pQVar7 = this->player1Score;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_194);
  QBoxLayout::addWidget(pQVar3,(int)pQVar7,(QFlags_conflict *)0x0);
  pQVar8 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(pQVar8,0x28,0x14,Expanding,Minimum);
  this->horizontalSpacer = pQVar8;
  (**(code **)(*(long *)this->horizontalLayout + 0x80))
            (this->horizontalLayout,this->horizontalSpacer);
  QBoxLayout::addLayout((QLayout *)this->verticalLayout,(int)this->horizontalLayout);
  pQVar6 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar6);
  this->horizontalLayout_2 = pQVar6;
  pQVar6 = this->horizontalLayout_2;
  QByteArrayView::QByteArrayView<19ul>(&local_1c0,(char (*) [19])"horizontalLayout_2");
  QVar19.m_data = (storage_type *)local_1c0.m_size;
  QVar19.m_size = (qsizetype)&local_1b0;
  QString::fromUtf8(QVar19);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_1b0);
  pQVar7 = (QLabel *)operator_new(0x28);
  pQVar3 = this->centralwidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c4);
  QLabel::QLabel(pQVar7,pQVar3,(QFlags_conflict *)(ulong)local_1c4.i);
  this->player2Label = pQVar7;
  pQVar7 = this->player2Label;
  QByteArrayView::QByteArrayView<13ul>(&local_1f0,(char (*) [13])"player2Label");
  QVar20.m_data = (storage_type *)local_1f0.m_size;
  QVar20.m_size = (qsizetype)&local_1e0;
  QString::fromUtf8(QVar20);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_1e0);
  pQVar3 = (QWidget *)this->horizontalLayout_2;
  pQVar7 = this->player2Label;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_1f4);
  QBoxLayout::addWidget(pQVar3,(int)pQVar7,(QFlags_conflict *)0x0);
  pQVar7 = (QLabel *)operator_new(0x28);
  pQVar3 = this->centralwidget;
  QFlags<Qt::WindowType>::QFlags(&local_1f8);
  QLabel::QLabel(pQVar7,pQVar3,(QFlags_conflict *)(ulong)local_1f8.i);
  this->player2Score = pQVar7;
  pQVar7 = this->player2Score;
  QByteArrayView::QByteArrayView<13ul>(&local_220,(char (*) [13])"player2Score");
  QVar21.m_data = (storage_type *)local_220.m_size;
  QVar21.m_size = (qsizetype)&local_210;
  QString::fromUtf8(QVar21);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_210);
  local_224.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_224.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_14c.bits,bVar2);
  local_228 = local_14c;
  QWidget::setSizePolicy((QSizePolicy *)this->player2Score);
  pQVar3 = (QWidget *)this->horizontalLayout_2;
  pQVar7 = this->player2Score;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_22c);
  QBoxLayout::addWidget(pQVar3,(int)pQVar7,(QFlags_conflict *)0x0);
  pQVar8 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(pQVar8,0x28,0x14,Expanding,Minimum);
  this->horizontalSpacer_2 = pQVar8;
  (**(code **)(*(long *)this->horizontalLayout_2 + 0x80))
            (this->horizontalLayout_2,this->horizontalSpacer_2);
  QBoxLayout::addLayout((QLayout *)this->verticalLayout,(int)this->horizontalLayout_2);
  pGVar9 = (GameBoard *)operator_new(0x70);
  GameBoard::GameBoard(pGVar9,this->centralwidget);
  this->gameBoard = pGVar9;
  pGVar9 = this->gameBoard;
  QByteArrayView::QByteArrayView<10ul>(&local_258,(char (*) [10])"gameBoard");
  QVar22.m_data = (storage_type *)local_258.m_size;
  QVar22.m_size = (qsizetype)&local_248;
  QString::fromUtf8(QVar22);
  QObject::setObjectName((QString *)pGVar9);
  QString::~QString(&local_248);
  pQVar3 = (QWidget *)this->verticalLayout;
  pGVar9 = this->gameBoard;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_25c);
  QBoxLayout::addWidget(pQVar3,(int)pGVar9,(QFlags_conflict *)0x0);
  QMainWindow::setCentralWidget((QWidget *)local_18);
  pQVar10 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(pQVar10,(QWidget *)local_18);
  this->menubar = pQVar10;
  pQVar10 = this->menubar;
  QByteArrayView::QByteArrayView<8ul>(&local_288,(char (*) [8])"menubar");
  QVar23.m_data = (storage_type *)local_288.m_size;
  QVar23.m_size = (qsizetype)&local_278;
  QString::fromUtf8(QVar23);
  QObject::setObjectName((QString *)pQVar10);
  QString::~QString(&local_278);
  pQVar10 = this->menubar;
  QRect::QRect(&local_298,0,0,0x250,0x16);
  QWidget::setGeometry((QRect *)pQVar10);
  QMainWindow::setMenuBar((QMenuBar *)local_18);
  pQVar11 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(pQVar11,(QWidget *)local_18);
  this->statusbar = pQVar11;
  pQVar11 = this->statusbar;
  QByteArrayView::QByteArrayView<10ul>(&local_2c0,(char (*) [10])"statusbar");
  QVar24.m_data = (storage_type *)local_2c0.m_size;
  QVar24.m_size = (qsizetype)&local_2b0;
  QString::fromUtf8(QVar24);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_2b0);
  QMainWindow::setStatusBar((QStatusBar *)local_18);
  retranslateUi(this,local_18);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(592, 471);
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        verticalLayout = new QVBoxLayout(centralwidget);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        beginNewGameButton = new QPushButton(centralwidget);
        beginNewGameButton->setObjectName(QString::fromUtf8("beginNewGameButton"));

        verticalLayout->addWidget(beginNewGameButton);

        horizontalLayout = new QHBoxLayout();
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        player1Label = new QLabel(centralwidget);
        player1Label->setObjectName(QString::fromUtf8("player1Label"));
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(player1Label->sizePolicy().hasHeightForWidth());
        player1Label->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(player1Label);

        player1Score = new QLabel(centralwidget);
        player1Score->setObjectName(QString::fromUtf8("player1Score"));
        sizePolicy.setHeightForWidth(player1Score->sizePolicy().hasHeightForWidth());
        player1Score->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(player1Score);

        horizontalSpacer = new QSpacerItem(40, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        horizontalLayout->addItem(horizontalSpacer);


        verticalLayout->addLayout(horizontalLayout);

        horizontalLayout_2 = new QHBoxLayout();
        horizontalLayout_2->setObjectName(QString::fromUtf8("horizontalLayout_2"));
        player2Label = new QLabel(centralwidget);
        player2Label->setObjectName(QString::fromUtf8("player2Label"));

        horizontalLayout_2->addWidget(player2Label);

        player2Score = new QLabel(centralwidget);
        player2Score->setObjectName(QString::fromUtf8("player2Score"));
        sizePolicy.setHeightForWidth(player2Score->sizePolicy().hasHeightForWidth());
        player2Score->setSizePolicy(sizePolicy);

        horizontalLayout_2->addWidget(player2Score);

        horizontalSpacer_2 = new QSpacerItem(40, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        horizontalLayout_2->addItem(horizontalSpacer_2);


        verticalLayout->addLayout(horizontalLayout_2);

        gameBoard = new GameBoard(centralwidget);
        gameBoard->setObjectName(QString::fromUtf8("gameBoard"));

        verticalLayout->addWidget(gameBoard);

        MainWindow->setCentralWidget(centralwidget);
        menubar = new QMenuBar(MainWindow);
        menubar->setObjectName(QString::fromUtf8("menubar"));
        menubar->setGeometry(QRect(0, 0, 592, 22));
        MainWindow->setMenuBar(menubar);
        statusbar = new QStatusBar(MainWindow);
        statusbar->setObjectName(QString::fromUtf8("statusbar"));
        MainWindow->setStatusBar(statusbar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }